

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jieba.hpp
# Opt level: O0

void __thiscall cppjieba::Jieba::ResetSeparators(Jieba *this,string *s)

{
  string *in_stack_00000510;
  SegmentBase *in_stack_00000518;
  
  SegmentBase::ResetSeparators(in_stack_00000518,in_stack_00000510);
  SegmentBase::ResetSeparators(in_stack_00000518,in_stack_00000510);
  SegmentBase::ResetSeparators(in_stack_00000518,in_stack_00000510);
  SegmentBase::ResetSeparators(in_stack_00000518,in_stack_00000510);
  SegmentBase::ResetSeparators(in_stack_00000518,in_stack_00000510);
  return;
}

Assistant:

void ResetSeparators(const string& s) {
    //TODO
    mp_seg_.ResetSeparators(s);
    hmm_seg_.ResetSeparators(s);
    mix_seg_.ResetSeparators(s);
    full_seg_.ResetSeparators(s);
    query_seg_.ResetSeparators(s);
  }